

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O1

uint64_t farmhash64_uo_with_seeds(char *s,size_t len,uint64_t seed0,uint64_t seed1)

{
  uint64_t uVar1;
  long lVar2;
  long *plVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  ulong local_58;
  
  if (len < 0x41) {
    uVar1 = farmhash64_na(s,len);
    lVar5 = -0x622015f714c7d297;
    uVar4 = (uVar1 - seed0 ^ seed1) * -0x622015f714c7d297;
    uVar4 = (uVar4 >> 0x2f ^ seed1 ^ uVar4) * -0x622015f714c7d297;
    uVar4 = uVar4 >> 0x2f ^ uVar4;
  }
  else {
    lVar13 = seed1 * -0x651e95c4d06fbfb1 + 0x71;
    uVar4 = (ulong)(lVar13 * -0x651e95c4d06fbfb1) >> 0x2f ^ lVar13 * -0x651e95c4d06fbfb1;
    local_58 = uVar4 * -0x651e95c4d06fbfb1;
    lVar5 = seed0 + uVar4 * 0x651e95c4d06fbfb1;
    lVar16 = seed0 * -0x651e95c4d06fbfb1;
    lVar2 = (ulong)((uint)lVar5 & 0x82) + 0x9ae16a3b2f90404f;
    plVar3 = (long *)(s + (len - 1 & 0xffffffffffffffc0));
    uVar4 = (ulong)((uint)(len - 1) & 0x3f);
    lVar6 = 0;
    uVar9 = 0;
    do {
      lVar17 = *(long *)((long)s + 8);
      lVar12 = *(long *)((long)s + 0x30);
      lVar11 = uVar9 + *(long *)((long)s + 0x38);
      uVar9 = (local_58 + *(long *)((long)s + 0x18)) * lVar2;
      lVar10 = (uVar9 >> 0x20 | uVar9 << 0x20) + lVar11;
      lVar20 = *(long *)s + lVar12 + lVar10 * 9;
      uVar14 = lVar13 + *(long *)((long)s + 0x10);
      uVar9 = seed0 + *(long *)((long)s + 0x20);
      lVar19 = (uVar9 >> 0x21 | uVar9 * 0x80000000) + *(long *)((long)s + 0x10);
      uVar7 = seed1 + lVar17 + *(long *)((long)s + 0x28);
      uVar9 = lVar16 + *(long *)s + lVar17;
      uVar9 = (uVar9 >> 0x1a | uVar9 << 0x26) * 9;
      lVar6 = (lVar6 + lVar12 ^ uVar9) * 9 + *(long *)((long)s + 0x20);
      lVar17 = uVar9 + lVar17;
      local_58 = uVar14 >> 0x1d | uVar14 << 0x23;
      lVar13 = lVar5 + *(long *)((long)s + 0x38) + lVar19;
      lVar5 = lVar17 - lVar13;
      seed0 = lVar19 + lVar5;
      uVar9 = lVar12 + *(long *)((long)s + 0x28) + lVar11 + lVar10 + lVar5;
      seed1 = (uVar7 >> 0x1e | uVar7 << 0x22) + *(long *)((long)s + 0x18) + lVar6;
      lVar6 = lVar6 + seed1;
      lVar16 = lVar17 + uVar9;
      uVar9 = uVar9 >> 0x22 | uVar9 * 0x40000000;
      s = (char *)((long)s + 0x40);
      lVar5 = lVar20;
    } while ((long *)s != plVar3);
    uVar21 = seed1 >> 0x1c | seed1 << 0x24;
    uVar8 = seed0 >> 0x14 | seed0 << 0x2c;
    lVar11 = lVar20 * 9 + lVar13;
    uVar15 = lVar13 + lVar11;
    lVar5 = *(long *)((long)plVar3 + (uVar4 - 0x37));
    uVar14 = (uVar8 - lVar16) + lVar5 + uVar15;
    uVar7 = *(ulong *)((long)plVar3 + (uVar4 - 0xf));
    uVar15 = uVar21 ^ uVar7 ^ uVar15;
    uVar14 = uVar9 * 9 ^ (uVar14 >> 0x25 | uVar14 * 0x8000000) * lVar2;
    lVar13 = *(long *)((long)plVar3 + (uVar4 - 0x17));
    uVar8 = uVar8 + lVar13 + (uVar15 >> 0x2a | uVar15 << 0x16) * lVar2;
    local_58 = local_58 + lVar6 + uVar4;
    uVar15 = local_58 >> 0x21 | local_58 * 0x80000000;
    lVar10 = uVar15 * lVar2;
    lVar19 = uVar21 * lVar2 + *(long *)((long)plVar3 + (uVar4 - 0x3f));
    lVar12 = uVar9 + lVar10 + *(long *)((long)plVar3 + (uVar4 - 0x1f));
    lVar16 = *(long *)((long)plVar3 + (uVar4 - 0x2f));
    lVar17 = *(long *)((long)plVar3 + (uVar4 - 7));
    uVar9 = lVar13 + uVar7 + lVar12;
    lVar13 = *(long *)((long)plVar3 + (uVar4 - 0x27)) + uVar14;
    uVar4 = lVar6 + uVar4 + lVar19 + lVar13;
    uVar21 = lVar5 + lVar16 + lVar19;
    uVar7 = uVar9 + lVar17 ^ uVar8;
    uVar18 = (uVar21 + lVar13 ^ uVar7) * lVar2;
    uVar18 = (uVar18 >> 0x2f ^ uVar7 ^ uVar18) * lVar2;
    uVar7 = lVar16 + uVar8 + lVar17 + lVar12;
    uVar9 = lVar12 + lVar10 + (uVar9 >> 0x2c | uVar9 * 0x100000) + (uVar7 >> 0x15 | uVar7 << 0x2b);
    lVar5 = -0x651e95c4d06fbfb1;
    uVar4 = ((uVar21 >> 0x2c | uVar21 * 0x100000) + lVar19 + uVar8 + (uVar4 >> 0x15 | uVar4 << 0x2b)
            ^ uVar9) * -0x651e95c4d06fbfb1;
    uVar4 = uVar4 >> 0x2f ^ uVar9 ^ uVar4;
    uVar14 = (uVar4 * -0x41befec400000000 | uVar4 * -0x651e95c4d06fbfb1 >> 0x1e) *
             -0x651e95c4d06fbfb1 ^ uVar14;
    uVar4 = (((uVar18 >> 0x2f ^ uVar18) + uVar15) * lVar2 - lVar11 ^ uVar14) * -0x651e95c4d06fbfb1;
    uVar4 = uVar4 >> 0x2f ^ uVar14 ^ uVar4;
    uVar4 = uVar4 * 0x5f20809e00000000 | uVar4 * -0x651e95c4d06fbfb1 >> 0x1f;
  }
  return uVar4 * lVar5;
}

Assistant:

uint64_t farmhash64_uo_with_seeds(const char *s, size_t len,
                         uint64_t seed0, uint64_t seed1) {
  if (len <= 64) {
    return farmhash64_na_with_seeds(s, len, seed0, seed1);
  }

  // For strings over 64 bytes we loop.  Internal state consists of
  // 64 bytes: u, v, w, x, y, and z.
  uint64_t x = seed0;
  uint64_t y = seed1 * k2 + 113;
  uint64_t z = smix(y * k2) * k2;
  uint128_c_t v = make_uint128_c_t(seed0, seed1);
  uint128_c_t w = make_uint128_c_t(0, 0);
  uint64_t u = x - z;
  x *= k2;
  uint64_t mul = k2 + (u & 0x82);

  // Set end so that after the loop we have 1 to 64 bytes left to process.
  const char* end = s + ((len - 1) / 64) * 64;
  const char* last64 = end + ((len - 1) & 63) - 63;
  assert(s + len - 64 == last64);
  do {
    uint64_t a0 = fetch64(s);
    uint64_t a1 = fetch64(s + 8);
    uint64_t a2 = fetch64(s + 16);
    uint64_t a3 = fetch64(s + 24);
    uint64_t a4 = fetch64(s + 32);
    uint64_t a5 = fetch64(s + 40);
    uint64_t a6 = fetch64(s + 48);
    uint64_t a7 = fetch64(s + 56);
    x += a0 + a1;
    y += a2;
    z += a3;
    v.a += a4;
    v.b += a5 + a1;
    w.a += a6;
    w.b += a7;

    x = ror64(x, 26);
    x *= 9;
    y = ror64(y, 29);
    z *= mul;
    v.a = ror64(v.a, 33);
    v.b = ror64(v.b, 30);
    w.a ^= x;
    w.a *= 9;
    z = ror64(z, 32);
    z += w.b;
    w.b += z;
    z *= 9;
    swap64(&u, &y);

    z += a0 + a6;
    v.a += a2;
    v.b += a3;
    w.a += a4;
    w.b += a5 + a6;
    x += a1;
    y += a7;

    y += v.a;
    v.a += x - y;
    v.b += w.a;
    w.a += v.b;
    w.b += x - y;
    x += w.b;
    w.b = ror64(w.b, 34);
    swap64(&u, &z);
    s += 64;
  } while (s != end);
  // Make s point to the last 64 bytes of input.
  s = last64;
  u *= 9;
  v.b = ror64(v.b, 28);
  v.a = ror64(v.a, 20);
  w.a += ((len - 1) & 63);
  u += y;
  y += u;
  x = ror64(y - x + v.a + fetch64(s + 8), 37) * mul;
  y = ror64(y ^ v.b ^ fetch64(s + 48), 42) * mul;
  x ^= w.b * 9;
  y += v.a + fetch64(s + 40);
  z = ror64(z + w.a, 33) * mul;
  v = weak_farmhash_na_len_32_with_seeds(s, v.b * mul, x + w.a);
  w = weak_farmhash_na_len_32_with_seeds(s + 32, z + w.b, y + fetch64(s + 16));
  return farmhash_uo_h(farmhash_len_16_mul(v.a + x, w.a ^ y, mul) + z - u,
           farmhash_uo_h(v.b + y, w.b + z, k2, 30) ^ x,
           k2,
           31);
}